

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

uint computesizes(uint *nums,uint *pna)

{
  bool bVar1;
  uint local_2c;
  uint local_28;
  uint optimal;
  uint na;
  uint a;
  uint twotoi;
  int i;
  uint *pna_local;
  uint *nums_local;
  
  optimal = 0;
  local_28 = 0;
  local_2c = 0;
  a = 0;
  na = 1;
  while( true ) {
    bVar1 = false;
    if (na != 0) {
      bVar1 = na >> 1 < *pna;
    }
    if (!bVar1) break;
    if ((nums[(int)a] != 0) && (optimal = nums[(int)a] + optimal, na >> 1 < optimal)) {
      local_2c = na;
      local_28 = optimal;
    }
    a = a + 1;
    na = na << 1;
  }
  *pna = local_28;
  return local_2c;
}

Assistant:

static unsigned int computesizes (unsigned int nums[], unsigned int *pna) {
  int i;
  unsigned int twotoi;  /* 2^i (candidate for optimal size) */
  unsigned int a = 0;  /* number of elements smaller than 2^i */
  unsigned int na = 0;  /* number of elements to go to array part */
  unsigned int optimal = 0;  /* optimal size for array part */
  /* loop while keys can fill more than half of total size */
  for (i = 0, twotoi = 1;
       twotoi > 0 && *pna > twotoi / 2;
       i++, twotoi *= 2) {
    if (nums[i] > 0) {
      a += nums[i];
      if (a > twotoi/2) {  /* more than half elements present? */
        optimal = twotoi;  /* optimal size (till now) */
        na = a;  /* all elements up to 'optimal' will go to array part */
      }
    }
  }
  lua_assert((optimal == 0 || optimal / 2 < na) && na <= optimal);
  *pna = na;
  return optimal;
}